

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# flatbuffer_builder.h
# Opt level: O1

void __thiscall
flatbuffers::FlatBufferBuilderImpl<false>::CreateStringImpl
          (FlatBufferBuilderImpl<false> *this,char *str,size_t len)

{
  uint *puVar1;
  uint8_t *__dest;
  
  NotNested(this);
  PreAlign<unsigned_int>(this,len + 1);
  vector_downward<unsigned_int>::fill(&this->buf_,1);
  if (len != 0) {
    vector_downward<unsigned_int>::ensure_space(&this->buf_,len);
    __dest = (this->buf_).cur_ + -len;
    (this->buf_).cur_ = __dest;
    puVar1 = &(this->buf_).size_;
    *puVar1 = *puVar1 + (uint)len;
    memcpy(__dest,str,len);
  }
  PushElement<unsigned_int,unsigned_int>(this,(uint)len);
  return;
}

Assistant:

void CreateStringImpl(const char *str, size_t len) {
    NotNested();
    PreAlign<uoffset_t>(len + 1);  // Always 0-terminated.
    buf_.fill(1);
    PushBytes(reinterpret_cast<const uint8_t *>(str), len);
    PushElement(static_cast<uoffset_t>(len));
  }